

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_variable.cpp
# Opt level: O1

adios2_error
adios2_variable_shape_with_memory_space
          (size_t *shape,adios2_variable *variable,adios2_memory_space mem)

{
  MemorySpace MVar1;
  void *local_88;
  long local_80;
  string local_60;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"for const adios2_variable, in call to adios2_variable_shape","");
  adios2::helper::CheckForNullptr<adios2_variable_const>(variable,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,"for size_t* shape, in call to adios2_variable_shape","");
  adios2::helper::CheckForNullptr<unsigned_long>(shape,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  switch(*(undefined4 *)(variable + 0x28)) {
  case 1:
    if (variable == (adios2_variable *)0x0) {
      MVar1 = Detect;
    }
    else {
      MVar1 = __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                             &adios2::core::Variable<signed_char>::typeinfo,0);
    }
    if (mem == adios2_memory_space_host) {
      adios2::core::VariableBase::Shape((ulong)&local_88);
    }
    else {
      adios2::core::VariableBase::Shape((ulong)&local_88,MVar1,~RowMajor);
    }
    break;
  case 2:
    if (variable == (adios2_variable *)0x0) {
      MVar1 = Detect;
    }
    else {
      MVar1 = __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                             &adios2::core::Variable<short>::typeinfo,0);
    }
    if (mem == adios2_memory_space_host) {
      adios2::core::VariableBase::Shape((ulong)&local_88);
    }
    else {
      adios2::core::VariableBase::Shape((ulong)&local_88,MVar1,~RowMajor);
    }
    break;
  case 3:
    if (variable == (adios2_variable *)0x0) {
      MVar1 = Detect;
    }
    else {
      MVar1 = __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                             &adios2::core::Variable<int>::typeinfo,0);
    }
    if (mem == adios2_memory_space_host) {
      adios2::core::VariableBase::Shape((ulong)&local_88);
    }
    else {
      adios2::core::VariableBase::Shape((ulong)&local_88,MVar1,~RowMajor);
    }
    break;
  case 4:
    if (variable == (adios2_variable *)0x0) {
      MVar1 = Detect;
    }
    else {
      MVar1 = __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                             &adios2::core::Variable<long>::typeinfo,0);
    }
    if (mem == adios2_memory_space_host) {
      adios2::core::VariableBase::Shape((ulong)&local_88);
    }
    else {
      adios2::core::VariableBase::Shape((ulong)&local_88,MVar1,~RowMajor);
    }
    break;
  case 5:
    if (variable == (adios2_variable *)0x0) {
      MVar1 = Detect;
    }
    else {
      MVar1 = __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                             &adios2::core::Variable<unsigned_char>::typeinfo,0);
    }
    if (mem == adios2_memory_space_host) {
      adios2::core::VariableBase::Shape((ulong)&local_88);
    }
    else {
      adios2::core::VariableBase::Shape((ulong)&local_88,MVar1,~RowMajor);
    }
    break;
  case 6:
    if (variable == (adios2_variable *)0x0) {
      MVar1 = Detect;
    }
    else {
      MVar1 = __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                             &adios2::core::Variable<unsigned_short>::typeinfo,0);
    }
    if (mem == adios2_memory_space_host) {
      adios2::core::VariableBase::Shape((ulong)&local_88);
    }
    else {
      adios2::core::VariableBase::Shape((ulong)&local_88,MVar1,~RowMajor);
    }
    break;
  case 7:
    if (variable == (adios2_variable *)0x0) {
      MVar1 = Detect;
    }
    else {
      MVar1 = __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                             &adios2::core::Variable<unsigned_int>::typeinfo,0);
    }
    if (mem == adios2_memory_space_host) {
      adios2::core::VariableBase::Shape((ulong)&local_88);
    }
    else {
      adios2::core::VariableBase::Shape((ulong)&local_88,MVar1,~RowMajor);
    }
    break;
  case 8:
    if (variable == (adios2_variable *)0x0) {
      MVar1 = Detect;
    }
    else {
      MVar1 = __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                             &adios2::core::Variable<unsigned_long>::typeinfo,0);
    }
    if (mem == adios2_memory_space_host) {
      adios2::core::VariableBase::Shape((ulong)&local_88);
    }
    else {
      adios2::core::VariableBase::Shape((ulong)&local_88,MVar1,~RowMajor);
    }
    break;
  case 9:
    if (variable == (adios2_variable *)0x0) {
      MVar1 = Detect;
    }
    else {
      MVar1 = __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                             &adios2::core::Variable<float>::typeinfo,0);
    }
    if (mem == adios2_memory_space_host) {
      adios2::core::VariableBase::Shape((ulong)&local_88);
    }
    else {
      adios2::core::VariableBase::Shape((ulong)&local_88,MVar1,~RowMajor);
    }
    break;
  case 10:
    if (variable == (adios2_variable *)0x0) {
      MVar1 = Detect;
    }
    else {
      MVar1 = __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                             &adios2::core::Variable<double>::typeinfo,0);
    }
    if (mem == adios2_memory_space_host) {
      adios2::core::VariableBase::Shape((ulong)&local_88);
    }
    else {
      adios2::core::VariableBase::Shape((ulong)&local_88,MVar1,~RowMajor);
    }
    break;
  case 0xb:
    if (variable == (adios2_variable *)0x0) {
      MVar1 = Detect;
    }
    else {
      MVar1 = __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                             &adios2::core::Variable<long_double>::typeinfo,0);
    }
    if (mem == adios2_memory_space_host) {
      adios2::core::VariableBase::Shape((ulong)&local_88);
    }
    else {
      adios2::core::VariableBase::Shape((ulong)&local_88,MVar1,~RowMajor);
    }
    break;
  case 0xc:
    if (variable == (adios2_variable *)0x0) {
      MVar1 = Detect;
    }
    else {
      MVar1 = __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                             &adios2::core::Variable<std::complex<float>>::typeinfo,0);
    }
    if (mem == adios2_memory_space_host) {
      adios2::core::VariableBase::Shape((ulong)&local_88);
    }
    else {
      adios2::core::VariableBase::Shape((ulong)&local_88,MVar1,~RowMajor);
    }
    break;
  case 0xd:
    if (variable == (adios2_variable *)0x0) {
      MVar1 = Detect;
    }
    else {
      MVar1 = __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                             &adios2::core::Variable<std::complex<double>>::typeinfo,0);
    }
    if (mem == adios2_memory_space_host) {
      adios2::core::VariableBase::Shape((ulong)&local_88);
    }
    else {
      adios2::core::VariableBase::Shape((ulong)&local_88,MVar1,~RowMajor);
    }
    break;
  case 0xe:
    if (variable == (adios2_variable *)0x0) {
      MVar1 = Detect;
    }
    else {
      MVar1 = __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                             &adios2::core::Variable<std::__cxx11::string>::typeinfo,0);
    }
    if (mem == adios2_memory_space_host) {
      adios2::core::VariableBase::Shape((ulong)&local_88);
    }
    else {
      adios2::core::VariableBase::Shape((ulong)&local_88,MVar1,~RowMajor);
    }
    break;
  case 0xf:
    if (variable == (adios2_variable *)0x0) {
      MVar1 = Detect;
    }
    else {
      MVar1 = __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                             &adios2::core::Variable<char>::typeinfo,0);
    }
    if (mem == adios2_memory_space_host) {
      adios2::core::VariableBase::Shape((ulong)&local_88);
    }
    else {
      adios2::core::VariableBase::Shape((ulong)&local_88,MVar1,~RowMajor);
    }
    break;
  default:
    goto switchD_00124a7c_default;
  }
  if (local_80 - (long)local_88 != 0) {
    memmove(shape,local_88,local_80 - (long)local_88);
  }
  if (local_88 != (void *)0x0) {
    operator_delete(local_88);
  }
switchD_00124a7c_default:
  return adios2_error_none;
}

Assistant:

adios2_error adios2_variable_shape_with_memory_space(size_t *shape, const adios2_variable *variable,
                                                     adios2_memory_space mem)
{
    try
    {
        adios2::helper::CheckForNullptr(variable, "for const adios2_variable, in call to "
                                                  "adios2_variable_shape");
        adios2::helper::CheckForNullptr(shape, "for size_t* shape, in call to "
                                               "adios2_variable_shape");

        const adios2::core::VariableBase *variableBase =
            reinterpret_cast<const adios2::core::VariableBase *>(variable);

        const adios2::DataType typeCpp = variableBase->m_Type;
        if (typeCpp == adios2::DataType::Struct)
        {
            // not supported
        }
#define declare_template_instantiation(T)                                                          \
    else if (typeCpp == adios2::helper::GetDataType<T>())                                          \
    {                                                                                              \
        const adios2::core::Variable<T> *variable =                                                \
            dynamic_cast<const adios2::core::Variable<T> *>(variableBase);                         \
        adios2::Dims shapeCpp;                                                                     \
        if (mem == adios2_memory_space_host)                                                       \
            shapeCpp = variable->Shape(adios2::EngineCurrentStep);                                 \
        else                                                                                       \
            shapeCpp = variable->Shape(adios2::EngineCurrentStep, adios2_ToMemorySpace(mem));      \
        std::copy(shapeCpp.begin(), shapeCpp.end(), shape);                                        \
    }
        ADIOS2_FOREACH_STDTYPE_1ARG(declare_template_instantiation)
#undef declare_template_instantiation

        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(adios2::helper::ExceptionToError("adios2_variable_shape"));
    }
}